

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xinclude(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlDocPtr pxVar9;
  xmlDocPtr pxVar10;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int *piVar11;
  int test_ret_1;
  xmlDocPtr in_RSI;
  int n_doc;
  int test_ret_3;
  ulong uVar12;
  int n_tree;
  uint uVar13;
  int test_ret;
  int local_3c;
  int local_38;
  int test_ret_2;
  
  if (quiet == '\0') {
    puts("Testing xinclude : 8 of 10 functions ...");
  }
  local_3c = 0;
  for (uVar13 = 0; uVar13 != 4; uVar13 = uVar13 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar9 = gen_xmlDocPtr(uVar13,(int)in_RSI);
    xmlXIncludeProcess(pxVar9);
    call_tests = call_tests + 1;
    des_xmlDocPtr((int)pxVar9,in_RSI,nr);
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcess",(ulong)(uint)(iVar3 - iVar2));
      local_3c = local_3c + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar13;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar13 = 0; uVar13 != 4; uVar13 = uVar13 + 1) {
    pxVar9 = (xmlDocPtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar3 = (int)pxVar9;
      if (iVar3 == 4) break;
      iVar4 = xmlMemBlocks();
      pxVar10 = gen_xmlDocPtr(uVar13,iVar2);
      uVar5 = gen_int(iVar3,iVar2);
      in_RSI = (xmlDocPtr)(ulong)uVar5;
      xmlXIncludeProcessFlags(pxVar10);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar10,in_RSI,nr_00);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessFlags",(ulong)(uint)(iVar2 - iVar4));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar13);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar9;
      }
      pxVar9 = (xmlDocPtr)(ulong)(iVar3 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_38 = 0;
  for (uVar13 = 0; uVar13 != 4; uVar13 = uVar13 + 1) {
    uVar12 = 0;
    while (iVar2 = (int)uVar12, iVar2 != 4) {
      pxVar9 = (xmlDocPtr)0x0;
      while( true ) {
        iVar4 = (int)in_RSI;
        iVar3 = (int)pxVar9;
        if (iVar3 == 3) break;
        iVar6 = xmlMemBlocks();
        pxVar10 = gen_xmlDocPtr(uVar13,iVar4);
        uVar5 = gen_int(iVar2,iVar4);
        piVar11 = &call_tests;
        if (iVar3 != 0) {
          if (iVar3 == 1) {
            piVar11 = (int *)0xffffffffffffffff;
          }
          else {
            piVar11 = (int *)0x0;
          }
        }
        in_RSI = (xmlDocPtr)(ulong)uVar5;
        xmlXIncludeProcessFlagsData(pxVar10,in_RSI,piVar11);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar10,in_RSI,nr_01);
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar6 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXIncludeProcessFlagsData",
                 (ulong)(uint)(iVar4 - iVar6));
          local_38 = local_38 + 1;
          printf(" %d",(ulong)uVar13);
          printf(" %d",uVar12);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar9;
        }
        pxVar9 = (xmlDocPtr)(ulong)(iVar3 + 1);
      }
      uVar12 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar1 = true;
  iVar2 = 0;
  while (bVar1) {
    pxVar9 = (xmlDocPtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar4 = (int)pxVar9;
      if (iVar4 == 3) break;
      iVar6 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar4,iVar3);
      xmlXIncludeProcessNode(0,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar4,(xmlNodePtr)in_RSI,nr_02);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar6 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessNode",(ulong)(uint)(iVar3 - iVar6));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar9;
      }
      pxVar9 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  for (uVar13 = 0; iVar3 = (int)in_RSI, uVar13 != 3; uVar13 = uVar13 + 1) {
    iVar4 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar13,iVar3);
    xmlXIncludeProcessTree(in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar13,(xmlNodePtr)in_RSI,nr_03);
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar4 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcessTree",(ulong)(uint)(iVar3 - iVar4));
      test_ret_2 = test_ret_2 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar13;
      printf(" %d");
      putchar(10);
    }
  }
  iVar3 = test_ret + local_3c + local_38;
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar13 = 0; uVar13 != 3; uVar13 = uVar13 + 1) {
    for (uVar5 = 0; iVar4 = (int)in_RSI, uVar5 != 4; uVar5 = uVar5 + 1) {
      iVar6 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar13,iVar4);
      iVar4 = gen_int(uVar5,iVar4);
      xmlXIncludeProcessTreeFlags(in_RSI,iVar4);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar13,(xmlNodePtr)in_RSI,nr_04);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar6 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessTreeFlags",(ulong)(uint)(iVar4 - iVar6)
              );
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar13);
        in_RSI = (xmlDocPtr)(ulong)uVar5;
        printf(" %d");
        putchar(10);
      }
    }
  }
  function_tests = function_tests + 1;
  local_38 = 0;
  for (uVar13 = 0; uVar13 != 3; uVar13 = uVar13 + 1) {
    uVar12 = 0;
    while (iVar4 = (int)uVar12, iVar4 != 4) {
      pxVar9 = (xmlDocPtr)0x0;
      while( true ) {
        iVar8 = (int)in_RSI;
        iVar6 = (int)pxVar9;
        if (iVar6 == 3) break;
        iVar7 = xmlMemBlocks();
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar13,iVar8);
        iVar8 = gen_int(iVar4,iVar8);
        piVar11 = &call_tests;
        if (iVar6 != 0) {
          if (iVar6 == 1) {
            piVar11 = (int *)0xffffffffffffffff;
          }
          else {
            piVar11 = (int *)0x0;
          }
        }
        xmlXIncludeProcessTreeFlagsData(in_RSI,iVar8,piVar11);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar13,(xmlNodePtr)in_RSI,nr_05);
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXIncludeProcessTreeFlagsData",
                 (ulong)(uint)(iVar8 - iVar7));
          local_38 = local_38 + 1;
          printf(" %d",(ulong)uVar13);
          printf(" %d",uVar12);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar9;
        }
        pxVar9 = (xmlDocPtr)(ulong)(iVar6 + 1);
      }
      uVar12 = (ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar1 = true;
  iVar4 = 0;
  while (bVar1) {
    for (uVar13 = 0; iVar6 = (int)in_RSI, uVar13 != 4; uVar13 = uVar13 + 1) {
      iVar8 = xmlMemBlocks();
      uVar5 = gen_int(uVar13,iVar6);
      in_RSI = (xmlDocPtr)(ulong)uVar5;
      xmlXIncludeSetFlags(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar8 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeSetFlags",(ulong)(uint)(iVar6 - iVar8));
        iVar4 = iVar4 + 1;
        printf(" %d",0);
        in_RSI = (xmlDocPtr)(ulong)uVar13;
        printf(" %d");
        putchar(10);
      }
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  uVar13 = iVar3 + iVar2 + test_ret_2 + local_3c + local_38 + iVar4;
  if (uVar13 != 0) {
    printf("Module xinclude: %d errors\n",(ulong)uVar13);
  }
  return uVar13;
}

Assistant:

static int
test_xinclude(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xinclude : 8 of 10 functions ...\n");
    test_ret += test_xmlXIncludeNewContext();
    test_ret += test_xmlXIncludeProcess();
    test_ret += test_xmlXIncludeProcessFlags();
    test_ret += test_xmlXIncludeProcessFlagsData();
    test_ret += test_xmlXIncludeProcessNode();
    test_ret += test_xmlXIncludeProcessTree();
    test_ret += test_xmlXIncludeProcessTreeFlags();
    test_ret += test_xmlXIncludeProcessTreeFlagsData();
    test_ret += test_xmlXIncludeSetFlags();

    if (test_ret != 0)
	printf("Module xinclude: %d errors\n", test_ret);
    return(test_ret);
}